

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O0

int cmdline_parser_required2(gengetopt_args_info *args_info,char *prog_name,char *additional_error)

{
  int iVar1;
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int error_occurred;
  char *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  FILE *pFVar2;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *local_68;
  char *local_50;
  char *local_38;
  int local_1c;
  uint max;
  
  max = (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_1c = 0;
  if (*(int *)(in_RDI + 200) == 0) {
    local_38 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_38 = "";
    }
    fprintf(_stderr,"%s: \'--output\' (\'-o\') option required%s\n",in_RSI,local_38);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0xcc) == 0) {
    local_50 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_50 = "";
    }
    fprintf(_stderr,"%s: \'--density\' option required%s\n",in_RSI,local_50);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_68 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_68 = "";
    }
    fprintf(_stderr,"%s: \'--nx\' option required%s\n",in_RSI,local_68);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0xd4) == 0) {
    in_stack_ffffffffffffff80 = in_RDX;
    if (in_RDX == (char *)0x0) {
      in_stack_ffffffffffffff80 = "";
    }
    fprintf(_stderr,"%s: \'--ny\' option required%s\n",in_RSI,in_stack_ffffffffffffff80);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0xd8) == 0) {
    in_stack_ffffffffffffff68 = in_RDX;
    if (in_RDX == (char *)0x0) {
      in_stack_ffffffffffffff68 = "";
    }
    pFVar2 = _stderr;
    fprintf(_stderr,"%s: \'--nz\' option required%s\n",in_RSI,in_stack_ffffffffffffff68);
    max = (uint)((ulong)pFVar2 >> 0x20);
    local_1c = 1;
    in_stack_ffffffffffffff78 = in_RSI;
  }
  iVar1 = check_multiple_option_occurrences
                    (in_stack_ffffffffffffff80,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (uint)in_stack_ffffffffffffff78,max,in_stack_ffffffffffffff68);
  if (iVar1 != 0) {
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

int
cmdline_parser_required2 (struct gengetopt_args_info *args_info, const char *prog_name, const char *additional_error)
{
  int error_occurred = 0;
  FIX_UNUSED (additional_error);

  /* checks for required options */
  if (! args_info->output_given)
    {
      fprintf (stderr, "%s: '--output' ('-o') option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->density_given)
    {
      fprintf (stderr, "%s: '--density' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->nx_given)
    {
      fprintf (stderr, "%s: '--nx' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->ny_given)
    {
      fprintf (stderr, "%s: '--ny' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (! args_info->nz_given)
    {
      fprintf (stderr, "%s: '--nz' option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (check_multiple_option_occurrences(prog_name, args_info->molFraction_given, args_info->molFraction_min, args_info->molFraction_max, "'--molFraction'"))
     error_occurred = 1;
  
  
  /* checks for dependences among options */

  return error_occurred;
}